

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_serialize
              (secp256k1_context *ctx,uchar *output32,secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  long in_RDX;
  uchar *in_RSI;
  secp256k1_ge pk;
  secp256k1_ge *in_stack_ffffffffffffff88;
  secp256k1_context *in_stack_ffffffffffffff90;
  int local_4;
  
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x20);
    if (in_RDX == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_xonly_pubkey_load
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         (secp256k1_xonly_pubkey *)0x1065b1);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_fe_impl_get_b32(in_RSI,(secp256k1_fe *)&stack0xffffffffffffff88);
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_xonly_pubkey_serialize(const secp256k1_context* ctx, unsigned char *output32, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_ge pk;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output32 != NULL);
    memset(output32, 0, 32);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    secp256k1_fe_get_b32(output32, &pk.x);
    return 1;
}